

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O1

void StartGame(void)

{
  int iVar1;
  string key;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  selectionLevel[4] = false;
  selectionLevel[0] = false;
  selectionLevel[1] = false;
  selectionLevel[2] = false;
  selectionLevel[3] = false;
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  do {
    while (Points < 0x191) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1f3a,0x1d);
      SelectLevel();
      TimeChoose();
      Flag = 1;
      while ((Flag != 0 && (Points < 0x191))) {
        SetTask();
      }
    }
    levelFive_abi_cxx11_[99].field_2._M_local_buf[(long)Token + 0xf] = '\x01';
    PrintGameMenu();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1f44,0x78);
    std::operator>>((istream *)&std::cin,(string *)&local_90);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_90 + local_88);
    InputCheck(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
    iVar1 = InputCheck(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 == 99) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GAME OVER\n",10);
    }
    Points = 0;
  } while( true );
}

Assistant:

void StartGame()
{
    selectionLevel[0] = false;
    selectionLevel[1] = false;
    selectionLevel[2] = false;
    selectionLevel[3] = false;
    selectionLevel[4] = false;
    string key;



    while (1) {
        while (Points <= 400) {
            cout << "Выбор уровня 1 - 5";
            SelectLevel();

            TimeChoose();
            Flag = 1;
            while ((Flag != 0) && (Points <= 400)) {
                SetTask();
            }
        }
        selectionLevel[Token - 1] = true;

        PrintGameMenu();
        cout << "Продолжишь или нет?Если да то введи любую кнопку ,если нет "
                "введи "
                "99\n";
        cin >> key;
        InputCheck(key);
        if(InputCheck(key)==99) {
            cout << "GAME OVER\n";
        }
        Points = 0;
    }

}